

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O2

off_t __thiscall Liby::FileDescriptor::getFileSize(FileDescriptor *this)

{
  int iVar1;
  mapped_type *this_00;
  __sighandler_t p_Var2;
  mapped_type *pp_Var3;
  stat *__buf;
  int __fd;
  int iStack_ac;
  stat st;
  
  __fd = this->fd_;
  if (__fd < 0) {
    __assert_fail("fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/FileDescriptor.cpp"
                  ,0x20,"off_t Liby::FileDescriptor::getFileSize()");
  }
  __buf = &st;
  iVar1 = fstat(__fd,(stat *)__buf);
  if (-1 < iVar1) {
    return st.st_size;
  }
  throw_err();
  iStack_ac = __fd;
  this_00 = std::__detail::
            _Map_base<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&functors,&iStack_ac);
  std::function<void_()>::operator=(this_00,(function<void_()> *)__buf);
  p_Var2 = signal(iStack_ac,signal_handler);
  pp_Var3 = std::__detail::
            _Map_base<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&stored_funcs,&iStack_ac);
  *pp_Var3 = (mapped_type)p_Var2;
  return (off_t)pp_Var3;
}

Assistant:

off_t FileDescriptor::getFileSize() {
    assert(fd() >= 0);

    struct stat st;
    int ret = ::fstat(fd(), &st);
    if (ret < 0) {
        throw_err();
    }
    return st.st_size;
}